

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void * lj_mem_newgco(lua_State *L,GCSize size)

{
  undefined8 uVar1;
  lua_State *L_00;
  uint32_t *puVar2;
  uint in_ESI;
  long in_RDI;
  GCobj *o;
  global_State *g;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 8);
  L_00[6].gclist.gcptr32 = (uint32_t)in_RDI;
  uVar1._0_4_ = L_00[1].glref;
  uVar1._4_4_ = L_00[1].gclist;
  puVar2 = (uint32_t *)(**(code **)(L_00 + 1))(uVar1,0,0,in_ESI);
  if (puVar2 == (uint32_t *)0x0) {
    lj_err_mem(L_00);
  }
  *(uint *)&L_00[1].base = in_ESI + *(int *)&L_00[1].base;
  L_00[2].top = (TValue *)((ulong)in_ESI + (long)L_00[2].top);
  *puVar2 = L_00[1].maxstack.ptr32;
  L_00[1].maxstack.ptr32 = (uint32_t)puVar2;
  *(byte *)(puVar2 + 1) = *(byte *)&L_00[1].top & 3;
  return puVar2;
}

Assistant:

void * LJ_FASTCALL lj_mem_newgco(lua_State *L, GCSize size)
{
  global_State *g = G(L);
  GCobj *o;

  setgcref(g->mem_L, obj2gco(L));
  o = (GCobj *)g->allocf(g->allocd, NULL, 0, size);
  if (o == NULL)
    lj_err_mem(L);
  lj_assertG(checkptrGC(o),
	     "allocated memory address %p outside required range", o);
  g->gc.total += size;
  g->gc.allocated += size;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  newwhite(g, o);
  return o;
}